

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_unit.c
# Opt level: O0

int zt_unit_run_suite(zt_unit *unit,zt_unit_suite *suite)

{
  int iVar1;
  long in_RSI;
  long in_RDI;
  int offt;
  int result;
  zt_unit_test *unit_test;
  zt_elist_t *tmp;
  char *local_38;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  zt_unit *pzVar2;
  zt_unit *local_18;
  
  *(int *)(in_RDI + 0x10) = *(int *)(in_RDI + 0x10) + 1;
  printf("---\n%s:\n",*(undefined8 *)(in_RSI + 0x20));
  printf("%*s%s:\n",2,"","Tests");
  for (local_18 = *(zt_unit **)(in_RSI + 0x18); local_18 != (zt_unit *)(in_RSI + 0x10);
      local_18 = (zt_unit *)(local_18->suites).next) {
    *(int *)(in_RDI + 0x14) = *(int *)(in_RDI + 0x14) + 1;
    pzVar2 = local_18;
    in_stack_ffffffffffffffdc =
         zt_unit_run_test(local_18,(zt_unit_suite *)
                                   CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                          (zt_unit_test *)
                          CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    if (in_stack_ffffffffffffffdc == 1) {
      *(int *)(in_RDI + 0x18) = *(int *)(in_RDI + 0x18) + 1;
      *(int *)(in_RSI + 0x48) = *(int *)(in_RSI + 0x48) + 1;
    }
    else {
      *(int *)(in_RSI + 0x4c) = *(int *)(in_RSI + 0x4c) + 1;
      *(int *)(in_RDI + 0x1c) = *(int *)(in_RDI + 0x1c) + 1;
    }
    if ((pzVar2[1].suites.prev == (zt_elist *)0x0) && (pzVar2[1].suites.next == (zt_elist *)0x0)) {
      *(int *)(in_RSI + 0x58) = *(int *)(in_RSI + 0x58) + 1;
      *(int *)(in_RDI + 0x28) = *(int *)(in_RDI + 0x28) + 1;
    }
    *(int *)(in_RSI + 0x54) = *(int *)(in_RSI + 0x54) + (int)pzVar2[1].suites.prev;
    *(int *)(in_RSI + 0x50) = *(int *)(in_RSI + 0x50) + (int)pzVar2[1].suites.next;
    *(int *)(in_RDI + 0x20) = *(int *)(in_RDI + 0x20) + (int)pzVar2[1].suites.prev;
    *(int *)(in_RDI + 0x24) = *(int *)(in_RDI + 0x24) + (int)pzVar2[1].suites.next;
  }
  if (*(int *)(in_RSI + 0x4c) != 0) {
    printf("%*s%s:\n",2,"","Errors");
    for (local_18 = *(zt_unit **)(in_RSI + 0x18); local_18 != (zt_unit *)(in_RSI + 0x10);
        local_18 = *(zt_unit **)((long)local_18 + 8)) {
      if (*(int *)((long)local_18 + 0x20) != 1) {
        pzVar2 = local_18;
        iVar1 = printf("%*s%s",4,"",*(undefined8 *)((long)local_18 + 0x10));
        if (*(long *)((long)pzVar2 + 0x28) == 0) {
          local_38 = "No Error Text";
        }
        else {
          local_38 = *(char **)((long)pzVar2 + 0x28);
        }
        printf("%*s: \'%s\'\n",(ulong)(uint)(((0x1e - iVar1) / 2) * 2 + (0x1e - iVar1) % 2),"",
               local_38);
      }
    }
  }
  return 0;
}

Assistant:

int
zt_unit_run_suite(struct zt_unit    * unit,
                  struct zt_unit_suite     * suite)
{
    zt_elist_t          * tmp;
    struct zt_unit_test * unit_test;
    int                   result;

    unit->suite_count++;

    printf("---\n%s:\n", suite->name);
    yaml_dict("Tests", 2);

    zt_elist_for_each(&suite->tests, tmp) {
        unit->tests++;

        unit_test = zt_elist_data(tmp, struct zt_unit_test, test);
        result = zt_unit_run_test(unit, suite, unit_test);
        if (result != TRUE) {
            suite->failed += 1;
            unit->failures += 1;
        } else {
            unit->successes += 1;
            suite->succeeded += 1;
        }
        if (unit_test->assertions == 0 && unit_test->exceptions == 0) {
          suite->empty++;
          unit->empty++;
        }
        suite->assertions += unit_test->assertions;
        suite->exceptions += unit_test->exceptions;
        unit->assertions += unit_test->assertions;
        unit->exceptions += unit_test->exceptions;
    }

    if (suite->failed != 0) {
        yaml_dict("Errors", 2);
        zt_elist_for_each(&suite->tests, tmp) {
            unit_test = zt_elist_data(tmp, struct zt_unit_test, test);
            if (unit_test->success != TRUE) {
                yaml_value(unit_test->name, 4, "'%s'", unit_test->error ? unit_test->error : "No Error Text");
            }
        }
    }
    return 0;
}